

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGenericHandler.cxx
# Opt level: O2

bool __thiscall
cmCTestGenericHandler::StartResultingXML
          (cmCTestGenericHandler *this,Part part,char *name,cmGeneratedFileStream *xofs)

{
  cmCTest *pcVar1;
  bool bVar2;
  ostream *poVar3;
  string local_338;
  ostringstream cmCTestLog_msg_1;
  size_type local_310;
  ostringstream ostr;
  
  if (name == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ostr);
    poVar3 = std::operator<<((ostream *)&ostr,
                             "Cannot create resulting XML file without providing the name");
    std::endl<char,std::char_traits<char>>(poVar3);
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestGenericHandler.cxx"
                 ,0x50,_cmCTestLog_msg_1,false);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ostr);
    return false;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ostr);
  std::operator<<((ostream *)&ostr,name);
  if (0 < this->SubmitIndex) {
    poVar3 = std::operator<<((ostream *)&ostr,"_");
    std::ostream::operator<<(poVar3,this->SubmitIndex);
  }
  std::operator<<((ostream *)&ostr,".xml");
  cmCTest::GetCurrentTag_abi_cxx11_((string *)&cmCTestLog_msg_1,this->CTest);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
  if (local_310 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_1);
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg_1,
                             "Current Tag empty, this may mean NightlyStartTime / CTEST_NIGHTLY_START_TIME was not set correctly. Or maybe you forgot to call ctest_start() before calling ctest_configure()."
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestGenericHandler.cxx"
                 ,0x5f,local_338._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_1);
    cmSystemTools::s_FatalErrorOccured = true;
  }
  else {
    pcVar1 = this->CTest;
    cmCTest::GetCurrentTag_abi_cxx11_((string *)&cmCTestLog_msg_1,pcVar1);
    std::__cxx11::stringbuf::str();
    bVar2 = cmCTest::OpenOutputFile(pcVar1,(string *)&cmCTestLog_msg_1,&local_338,xofs,true);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
    if (bVar2) {
      pcVar1 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::AddSubmitFile(pcVar1,part,_cmCTestLog_msg_1);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
      bVar2 = true;
      goto LAB_00172648;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_1);
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg_1,"Cannot create resulting XML file: ");
    std::__cxx11::stringbuf::str();
    poVar3 = std::operator<<(poVar3,(string *)&local_338);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_338);
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestGenericHandler.cxx"
                 ,0x67,local_338._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_1);
  }
  bVar2 = false;
LAB_00172648:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ostr);
  return bVar2;
}

Assistant:

bool cmCTestGenericHandler::StartResultingXML(cmCTest::Part part,
                                              const char* name,
                                              cmGeneratedFileStream& xofs)
{
  if (!name) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create resulting XML file without providing the name"
                 << std::endl;);
    return false;
  }
  std::ostringstream ostr;
  ostr << name;
  if (this->SubmitIndex > 0) {
    ostr << "_" << this->SubmitIndex;
  }
  ostr << ".xml";
  if (this->CTest->GetCurrentTag().empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Current Tag empty, this may mean NightlyStartTime / "
               "CTEST_NIGHTLY_START_TIME was not set correctly. Or "
               "maybe you forgot to call ctest_start() before calling "
               "ctest_configure()."
                 << std::endl);
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }
  if (!this->CTest->OpenOutputFile(this->CTest->GetCurrentTag(), ostr.str(),
                                   xofs, true)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create resulting XML file: " << ostr.str()
                                                    << std::endl);
    return false;
  }
  this->CTest->AddSubmitFile(part, ostr.str().c_str());
  return true;
}